

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testserverconnector.hpp
# Opt level: O2

void __thiscall TestServerConnector::SendRawRequest(TestServerConnector *this,string *request)

{
  string local_30 [32];
  
  (*this->handler->_vptr_JsonRpcServer[2])(local_30,this->handler,request);
  std::__cxx11::string::operator=((string *)&this->raw_response,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void SendRawRequest(const string &request) { this->raw_response = handler.HandleRequest(request); }